

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O1

int CheckerBigTriangle(void)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  char *__s;
  bool bVar6;
  TPoint point;
  int found [3];
  TPoint pointOut [3];
  int local_64;
  int local_60 [6];
  int local_48 [6];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar5 = 0xffffffff;
  }
  else {
    local_48[0] = -0x80000000;
    local_48[1] = -0x80000000;
    local_48[2] = 0x7fffffff;
    local_48[3] = 0x7fffffff;
    local_48[4] = 0x7fffffff;
    local_48[5] = 0x7fffffff;
    if (bigTrianglesN == 2) {
      local_48[4] = 0x7ffe7961;
      local_48[5] = 0x7fffffff;
    }
    else if (bigTrianglesN == 1) {
      local_48[4] = 0x7fffffff;
      local_48[5] = 0x7ffe7961;
    }
    local_60[4] = 0;
    local_60[2] = 0;
    local_60[3] = 0;
    bVar6 = false;
    __s = "FAILED";
    uVar5 = 0;
    local_64 = 0;
    do {
      local_60[0] = 0;
      local_60[1] = 0;
      pcVar3 = ScanIntInt((FILE *)__stream,local_60,local_60 + 1);
      if (pcVar3 == "FAILED") {
        fclose(__stream);
        pcVar3 = "short output -- %s\n";
LAB_00102b76:
        bVar1 = false;
        printf(pcVar3,"FAILED");
      }
      else {
        lVar4 = 0;
        do {
          if ((local_60[0] == local_48[lVar4 * 2]) && (local_60[1] == local_48[lVar4 * 2 + 1])) {
            if (local_60[lVar4 + 2] == 1) {
              fclose(__stream);
              pcVar3 = "wrong output -- %s\n";
              goto LAB_00102b76;
            }
            local_60[lVar4 + 2] = local_60[lVar4 + 2] + 1;
            local_64 = local_64 + 1;
            break;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        bVar1 = true;
      }
      if (!bVar1) break;
      bVar6 = 1 < uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 3);
    uVar5 = 1;
    if (bVar6) {
      if (local_64 == 3) {
        iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
        bigTrianglesN = bigTrianglesN + 1;
        fclose(__stream);
        if (iVar2 == 0) {
          __s = "PASSED";
        }
        puts(__s);
        uVar5 = (uint)(iVar2 != 0);
      }
      else {
        fclose(__stream);
        printf("wrong output -- %s\n","FAILED");
      }
    }
  }
  return uVar5;
}

Assistant:

static int CheckerBigTriangle(void)
{
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        return -1;
    }

    TPoint pointOut[3] =  { { INT_MIN, INT_MIN }, { INT_MAX, INT_MAX }, { INT_MAX, INT_MAX } };
    if (bigTrianglesN == 1) {
        pointOut[2].y = INT_MAX - MAX_POINT_COUNT + 2;
    }
    else if (bigTrianglesN == 2) {
        pointOut[2].x = INT_MAX - MAX_POINT_COUNT + 2;
    } 

    int found[3] = { 0 };
    int foundCount = 0;
    for (int i = 0; i < 3; ++i) {
        TPoint point = { 0, 0 };
        if (ScanPoint(out, &point) == Fail) {
            fclose(out);
            printf("short output -- %s\n", Fail);
            return 1;
        }

        for (int j = 0; j < 3; ++j) {
            if (point.x == pointOut[j].x && point.y == pointOut[j].y) {
                if (found[j] == 1) {
                    fclose(out);
                    printf("wrong output -- %s\n", Fail);
                    return 1;
                }
                
                ++found[j];
                ++foundCount;
                break;
            }
        }
    }
    
    if (foundCount != 3) {
        fclose(out);
        printf("wrong output -- %s\n", Fail);
        return 1;
    }

    int passed = !HaveGarbageAtTheEnd(out);

    ++bigTrianglesN;
    fclose(out);
    printf("%s\n", (passed) ? Pass : Fail);
    return !passed;
}